

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall
duckdb::WindowGlobalSinkState::WindowGlobalSinkState
          (WindowGlobalSinkState *this,PhysicalWindow *op,ClientContext *context)

{
  WindowAggregationMode WVar1;
  _Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false> _Var2;
  _Alloc_hider _Var3;
  const_reference pvVar4;
  pointer pEVar5;
  DBConfig *pDVar6;
  BoundWindowExpression *args;
  InternalException *this_00;
  ExpressionType type;
  ulong __n;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::WindowExecutor_*,_false> local_b8;
  WindowSharedExpressions *local_b0;
  ClientContext *local_a8;
  allocator local_99;
  string local_98;
  WindowAggregationMode local_74;
  unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
  *local_70;
  WindowGlobalSinkState *local_68;
  vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
  *local_60;
  BoundWindowExpression *local_58;
  string local_50;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__WindowGlobalSinkState_027b6c68;
  this->op = op;
  this->context = context;
  local_70 = &this->global_partition;
  local_60 = (vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
              *)&this->executors;
  local_b0 = &this->shared;
  (this->global_partition).
  super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl =
       (WindowPartitionGlobalSinkState *)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = context;
  local_68 = this;
  WindowSharedExpressions::WindowSharedExpressions(local_b0);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(&op->select_list,op->order_idx);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  local_58 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar5->super_BaseExpression);
  pDVar6 = DBConfig::GetConfig(local_a8);
  WVar1 = (pDVar6->options).window_mode;
  for (__n = 0; __n < (ulong)((long)(op->select_list).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(op->select_list).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&op->select_list,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    args = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar5->super_BaseExpression);
    local_74 = WVar1;
    switch((args->super_Expression).super_BaseExpression.type) {
    case WINDOW_AGGREGATE:
      make_uniq<duckdb::WindowAggregateExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&,duckdb::WindowAggregationMode&>
                ((duckdb *)&local_98,args,local_a8,local_b0,&local_74);
      break;
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_98,"Window aggregate type %s",&local_99);
      ExpressionTypeToString_abi_cxx11_
                (&local_50,(duckdb *)(ulong)(args->super_Expression).super_BaseExpression.type,type)
      ;
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_98,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case WINDOW_RANK:
      make_uniq<duckdb::WindowRankExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_RANK_DENSE:
      make_uniq<duckdb::WindowDenseRankExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_NTILE:
      make_uniq<duckdb::WindowNtileExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_PERCENT_RANK:
      make_uniq<duckdb::WindowPercentRankExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_CUME_DIST:
      make_uniq<duckdb::WindowCumeDistExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_ROW_NUMBER:
      make_uniq<duckdb::WindowRowNumberExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_FIRST_VALUE:
      make_uniq<duckdb::WindowFirstValueExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_LAST_VALUE:
      make_uniq<duckdb::WindowLastValueExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_LEAD:
    case WINDOW_LAG:
      make_uniq<duckdb::WindowLeadLagExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
      break;
    case WINDOW_NTH_VALUE:
      make_uniq<duckdb::WindowNthValueExecutor,duckdb::BoundWindowExpression&,duckdb::ClientContext&,duckdb::WindowSharedExpressions&>
                ((duckdb *)&local_98,args,local_a8,local_b0);
    }
    local_b8._M_head_impl = (WindowExecutor *)local_98._M_dataplus._M_p;
    ::std::
    vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>
              (local_60,(unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                         *)&local_b8);
    if ((WindowPartitionGlobalSinkState *)local_b8._M_head_impl !=
        (WindowPartitionGlobalSinkState *)0x0) {
      (*((PartitionGlobalSinkState *)&(local_b8._M_head_impl)->_vptr_WindowExecutor)->
        _vptr_PartitionGlobalSinkState[1])();
    }
  }
  make_uniq<duckdb::WindowPartitionGlobalSinkState,duckdb::WindowGlobalSinkState&,duckdb::BoundWindowExpression&>
            ((duckdb *)&local_98,local_68,local_58);
  _Var3._M_p = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)0x0;
  _Var2._M_head_impl =
       (local_70->
       super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl;
  (local_70->
  super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl =
       (WindowPartitionGlobalSinkState *)_Var3._M_p;
  if ((_Var2._M_head_impl != (WindowPartitionGlobalSinkState *)0x0) &&
     ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_PartitionGlobalSinkState + 8))(),
     (long *)local_98._M_dataplus._M_p != (long *)0x0)) {
    (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
  }
  return;
}

Assistant:

WindowGlobalSinkState::WindowGlobalSinkState(const PhysicalWindow &op, ClientContext &context)
    : op(op), context(context) {

	D_ASSERT(op.select_list[op.order_idx]->GetExpressionClass() == ExpressionClass::BOUND_WINDOW);
	auto &wexpr = op.select_list[op.order_idx]->Cast<BoundWindowExpression>();

	const auto mode = DBConfig::GetConfig(context).options.window_mode;
	for (idx_t expr_idx = 0; expr_idx < op.select_list.size(); ++expr_idx) {
		D_ASSERT(op.select_list[expr_idx]->GetExpressionClass() == ExpressionClass::BOUND_WINDOW);
		auto &wexpr = op.select_list[expr_idx]->Cast<BoundWindowExpression>();
		auto wexec = WindowExecutorFactory(wexpr, context, shared, mode);
		executors.emplace_back(std::move(wexec));
	}

	global_partition = make_uniq<WindowPartitionGlobalSinkState>(*this, wexpr);
}